

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::BlueRoomTwo(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  mapped_type *ppIVar1;
  key_type local_104;
  string local_100;
  string local_e0;
  string local_c0;
  Item local_a0;
  Item local_78;
  Item local_50;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_c0,"BabbleFish",(allocator *)&local_104);
  Item::Item(&local_50,&local_c0,FISH);
  ItemWrapper::ItemWrapper(this_00,&local_50,HIDDEN);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c0);
  this_01 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_e0,"Ceiling",(allocator *)&local_104);
  Item::Item(&local_78,&local_e0,CEILING);
  ItemWrapper::ItemWrapper(this_01,&local_78,B_ROOM2);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_e0);
  this_02 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_100,"Glyphs",(allocator *)&local_104);
  Item::Item(&local_a0,&local_100,GLYPHS);
  ItemWrapper::ItemWrapper(this_02,&local_a0,B_ROOM2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  local_104 = FISH;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_00;
  local_104 = CEILING;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_01;
  local_104 = GLYPHS;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_02;
  return;
}

Assistant:

void ItemTable::BlueRoomTwo() {

    ItemWrapper * BabbleFish    = new ItemWrapper(Item("BabbleFish", FISH), HIDDEN);
    ItemWrapper * Ceiling       = new ItemWrapper(Item("Ceiling", CEILING), B_ROOM2);
    ItemWrapper * Glpyhs        = new ItemWrapper(Item("Glyphs", GLYPHS), B_ROOM2);

    items[FISH] = BabbleFish;
    items[CEILING] = Ceiling;
    items[GLYPHS] = Glpyhs;
}